

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O2

int ffgtam(fitsfile *gfptr,fitsfile *mfptr,int hdupos,int *status)

{
  ulong uVar1;
  uint uVar2;
  fitsfile *pfVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  size_t sVar7;
  long lVar8;
  char *pcVar9;
  int *piVar10;
  bool bVar11;
  uchar charNull [1];
  fitsfile *tmpfptr;
  char local_27e1;
  long nmembers;
  ulong local_27d8;
  char *tmpPtr [1];
  uint local_27c8;
  int memberPosition;
  int uriCol;
  int locationCol;
  long groupExtver;
  int iomode;
  long memberExtver;
  char memberURI [4];
  int groupIOstate;
  int memberIOstate;
  int nkeys;
  int hdutype;
  int grptype;
  int positionCol;
  int extverCol;
  int extnameCol;
  long grpid;
  long local_2770;
  char *tgrplc;
  ulong local_2760;
  long memberID;
  int xtensionCol;
  char card [81];
  char memberExtname [71];
  char memberAccess1 [71];
  char groupAccess1 [71];
  char memberHDUtype [71];
  char keyword [75];
  char memberAccess2 [71];
  char groupAccess2 [71];
  char groupLocation [1025];
  char groupFileName [1025];
  char memberFileName [1025];
  char grootname [1025];
  char tmprootname [1025];
  char memberLocation [1025];
  char cwd [1025];
  char tmp [1025];
  char grplc [1025];
  
  memberPosition = 0;
  grptype = 0;
  hdutype = 0;
  memberExtver = 0;
  groupExtver = 0;
  memberID = 0;
  nmembers = 0;
  local_2760 = 0;
  grpid = 0;
  nkeys = 6;
  tmpfptr = (fitsfile *)0x0;
  builtin_strncpy(memberURI,"URL",4);
  charNull[0] = '\0';
  if (*status != 0) {
    return *status;
  }
  ffflmd(gfptr,&iomode,status);
  if (iomode != 1) {
    ffpmsg("cannot modify grouping table (ffgtam)");
    *status = 0x15d;
    iVar4 = 0;
    goto LAB_00175565;
  }
  pfVar3 = mfptr;
  if (mfptr == (fitsfile *)0x0) {
    iVar4 = ffreopen(gfptr,&tmpfptr,status);
    *status = iVar4;
    iVar5 = ffmahd(tmpfptr,hdupos,&hdutype,status);
    *status = iVar5;
    iVar4 = 0;
    pfVar3 = tmpfptr;
    if (iVar5 == 0) goto LAB_00175382;
  }
  else {
LAB_00175382:
    tmpfptr = pfVar3;
    iVar4 = ffgkys(tmpfptr,"XTENSION",memberHDUtype,card,status);
    *status = iVar4;
    if (iVar4 == 0xca) {
      builtin_strncpy(memberHDUtype,"PRIMARY",8);
      *status = 0;
    }
    prepare_keyvalue(memberHDUtype);
    iVar4 = ffgkyj(tmpfptr,"EXTVER",&memberExtver,card,status);
    *status = iVar4;
    if (iVar4 == 0xca) {
      memberExtver = 1;
      *status = 0;
    }
    iVar4 = ffgkys(tmpfptr,"EXTNAME",memberExtname,card,status);
    *status = iVar4;
    if (iVar4 == 0xca) {
      memberExtname[0] = '\0';
      *status = 0;
    }
    prepare_keyvalue(memberExtname);
    ffghdn(tmpfptr,&memberPosition);
    iVar4 = fits_get_url(tmpfptr,memberFileName,memberLocation,memberAccess1,memberAccess2,
                         &memberIOstate,status);
    *status = iVar4;
    if (memberFileName[0] == '\0') {
      strcpy(memberFileName,memberLocation);
      strcpy(memberAccess1,memberAccess2);
    }
    iVar5 = fits_get_url(gfptr,groupFileName,groupLocation,groupAccess1,groupAccess2,&groupIOstate,
                         status);
    *status = iVar5;
    iVar4 = 0;
    if (iVar5 == 0) {
      if (groupIOstate == 0) {
        ffpmsg("cannot modify grouping table (ffgtam)");
        *status = 0x15d;
        iVar4 = 0;
      }
      else {
        iVar5 = fits_strcasecmp(groupAccess1,"file://");
        if ((iVar5 == 0) || (iVar5 = fits_strcasecmp(memberAccess1,"file://"), iVar5 == 0)) {
          iVar5 = fits_get_cwd(cwd,status);
          *status = iVar5;
          iVar5 = fits_strcasecmp(memberAccess1,"file://");
          if (iVar5 == 0) {
            if (memberFileName[0] == '/') {
              strcpy(memberLocation,memberFileName);
LAB_001756b4:
              iVar5 = fits_clean_url(memberLocation,memberFileName,status);
              *status = iVar5;
              goto LAB_001756ce;
            }
            strcpy(memberLocation,cwd);
            sVar6 = strlen(memberLocation);
            sVar7 = strlen(memberFileName);
            if (0xfffffffffffffbfe < (sVar7 + sVar6) - 0x400) {
              sVar6 = strlen(memberLocation);
              (memberLocation + sVar6)[0] = '/';
              (memberLocation + sVar6)[1] = '\0';
              strcat(memberLocation,memberFileName);
              goto LAB_001756b4;
            }
            pcVar9 = "member path and filename is too long (ffgtam)";
LAB_00175756:
            ffpmsg(pcVar9);
            *status = 0x7d;
            iVar4 = 0;
            goto LAB_00175565;
          }
LAB_001756ce:
          iVar5 = fits_strcasecmp(groupAccess1,"file://");
          if (iVar5 == 0) {
            if (groupFileName[0] == '/') {
              strcpy(groupLocation,groupFileName);
            }
            else {
              strcpy(groupLocation,cwd);
              sVar6 = strlen(groupLocation);
              sVar7 = strlen(groupFileName);
              if ((sVar7 + sVar6) - 0x400 < 0xfffffffffffffbff) {
                pcVar9 = "group path and filename is too long (ffgtam)";
                goto LAB_00175756;
              }
              sVar6 = strlen(groupLocation);
              (groupLocation + sVar6)[0] = '/';
              (groupLocation + sVar6)[1] = '\0';
              strcat(groupLocation,groupFileName);
            }
            iVar5 = fits_clean_url(groupLocation,groupFileName,status);
            *status = iVar5;
          }
          iVar5 = fits_strcasecmp(groupAccess1,"file://");
          if ((iVar5 == 0) && (iVar5 = fits_strcasecmp(memberAccess1,"file://"), iVar5 == 0)) {
            fits_url2relurl(memberFileName,groupFileName,groupLocation,status);
            fits_url2relurl(groupFileName,memberFileName,memberLocation,status);
            strcpy(memberFileName,memberLocation);
            strcpy(groupFileName,groupLocation);
          }
        }
        else {
          cwd[0] = '\0';
        }
        iVar5 = ffgkyj(gfptr,"EXTVER",&groupExtver,card,status);
        *status = iVar5;
        ffrtnm(tmpfptr->Fptr->filename,tmprootname,status);
        ffrtnm(gfptr->Fptr->filename,grootname,status);
        if ((tmpfptr->Fptr != gfptr->Fptr) &&
           (iVar5 = strncmp(tmprootname,grootname,0x401), iVar5 != 0)) {
          groupExtver = -groupExtver;
        }
        iVar5 = ffgtnm(gfptr,&nmembers,status);
        *status = iVar5;
        iVar5 = ffgmf(gfptr,memberHDUtype,memberExtname,(int)memberExtver,memberPosition,
                      memberFileName,&memberID,status);
        *status = iVar5;
        if (iVar5 == 0) {
          ffpmsg("Specified HDU is already a member of the Grouping table (ffgtam)");
          iVar4 = 0x155;
        }
        else {
          if (iVar5 != 0x156) goto LAB_00175565;
          *status = 0;
          iVar4 = ffirow(gfptr,nmembers,1,status);
          *status = iVar4;
          nmembers = nmembers + 1;
          iVar4 = ffgtgc(gfptr,&xtensionCol,&extnameCol,&extverCol,&positionCol,&locationCol,&uriCol
                         ,&grptype,status);
          *status = iVar4;
          if (xtensionCol != 0) {
            tmpPtr[0] = memberHDUtype;
            ffpcls(gfptr,xtensionCol,nmembers,1,1,tmpPtr,status);
          }
          tmpPtr[0] = memberExtname;
          if (extnameCol != 0) {
            if (memberExtname[0] == '\0') {
              ffpclb(gfptr,extnameCol,nmembers,1,1,charNull,status);
            }
            else {
              ffpcls(gfptr,extnameCol,nmembers,1,1,tmpPtr,status);
            }
          }
          if (extverCol != 0) {
            ffpclj(gfptr,extverCol,nmembers,1,1,&memberExtver,status);
          }
          if (positionCol != 0) {
            ffpclk(gfptr,positionCol,nmembers,1,1,&memberPosition,status);
          }
          tmpPtr[0] = memberFileName;
          if (locationCol != 0) {
            ffrtnm(tmpfptr->Fptr->filename,tmprootname,status);
            ffrtnm(gfptr->Fptr->filename,grootname,status);
            if ((tmpfptr->Fptr == gfptr->Fptr) ||
               (iVar4 = strncmp(tmprootname,grootname,0x401), iVar4 == 0)) {
              ffpclb(gfptr,locationCol,nmembers,1,1,charNull,status);
            }
            else {
              ffpcls(gfptr,locationCol,nmembers,1,1,tmpPtr,status);
            }
          }
          tmpPtr[0] = memberURI;
          iVar4 = 0;
          if (uriCol != 0) {
            ffrtnm(tmpfptr->Fptr->filename,tmprootname,status);
            ffrtnm(gfptr->Fptr->filename,grootname,status);
            if ((tmpfptr->Fptr == gfptr->Fptr) ||
               (iVar5 = strncmp(tmprootname,grootname,0x401), iVar5 == 0)) {
              ffpclb(gfptr,uriCol,nmembers,1,1,charNull,status);
            }
            else {
              ffpcls(gfptr,uriCol,nmembers,1,1,tmpPtr,status);
            }
          }
        }
        if (*status == 0) {
          ffflmd(tmpfptr,&iomode,status);
          if ((memberIOstate == 0) || (iomode != 1)) {
            ffpmsg("cannot add GRPID/LC keywords to member HDU: (ffgtam)");
            pcVar9 = memberFileName;
          }
          else {
            iVar5 = ffgmng(tmpfptr,(long *)&local_2760,status);
            *status = iVar5;
            local_27d8 = local_2760;
            local_27e1 = cwd[0];
            bVar11 = false;
            lVar8 = 1;
            while ((local_27c8 = (uint)lVar8, !bVar11 && (lVar8 <= (long)local_27d8))) {
              if (*status != 0) goto LAB_00175f1f;
              bVar11 = false;
              local_2770 = lVar8;
              snprintf(keyword,0x4b,"GRPID%d",local_27d8);
              iVar5 = ffgkyj(tmpfptr,keyword,&grpid,card,status);
              *status = iVar5;
              if ((grpid == groupExtver) && (bVar11 = true, grpid < 0)) {
                snprintf(keyword,0x4b,"GRPLC%d",local_27d8);
                iVar5 = ffgkls(mfptr,keyword,&tgrplc,card,status);
                pcVar9 = tgrplc;
                *status = iVar5;
                if (iVar5 == 0) {
                  strcpy(grplc,tgrplc);
                  free(pcVar9);
                }
                if (local_27e1 != '\0') {
                  iVar5 = fits_is_url_absolute(grplc);
                  if ((iVar5 == 0) &&
                     (fits_path2url(grplc,0x401,groupLocation,status), groupLocation[0] != '/')) {
                    strcpy(tmp,cwd);
                    sVar6 = strlen(tmp);
                    sVar7 = strlen(groupLocation);
                    if (0xfffffffffffffbfe < (sVar7 + sVar6) - 0x400) {
                      sVar6 = strlen(tmp);
                      (tmp + sVar6)[0] = '/';
                      (tmp + sVar6)[1] = '\0';
                      strcat(tmp,groupLocation);
                      fits_clean_url(tmp,grplc,status);
                      goto LAB_00175e09;
                    }
LAB_00175e74:
                    ffpmsg("path and group location is too long (ffgtam)");
                    *status = 0x7d;
                    bVar11 = false;
                    goto LAB_00175ed7;
                  }
LAB_00175e09:
                  iVar5 = fits_is_url_absolute(groupFileName);
                  if ((iVar5 == 0) &&
                     (fits_path2url(groupFileName,0x401,groupLocation,status),
                     groupLocation[0] != '/')) {
                    strcpy(tmp,cwd);
                    sVar6 = strlen(tmp);
                    sVar7 = strlen(groupLocation);
                    if ((sVar7 + sVar6) - 0x400 < 0xfffffffffffffbff) goto LAB_00175e74;
                    sVar6 = strlen(tmp);
                    (tmp + sVar6)[0] = '/';
                    (tmp + sVar6)[1] = '\0';
                    strcat(tmp,groupLocation);
                    fits_clean_url(tmp,groupLocation,status);
                  }
                }
                iVar5 = strcmp(grplc,groupLocation);
                bVar11 = iVar5 == 0;
              }
LAB_00175ed7:
              lVar8 = local_2770 + 1;
            }
            if (!bVar11) {
              if (local_27d8 == 0) {
                local_27c8 = 0;
                *status = 0xca;
                iVar5 = 0xca;
                piVar10 = &DAT_001d2958;
                while (uVar2 = local_27c8, local_27c8 < 6) {
                  if (iVar5 != 0xca) goto LAB_001760fb;
                  *status = 0;
                  iVar5 = ffgcrd(tmpfptr,(char *)((long)&DAT_001d2958 + (long)*piVar10),card,status)
                  ;
                  *status = iVar5;
                  piVar10 = piVar10 + 1;
                  local_27c8 = uVar2 + 1;
                }
                if (iVar5 == 0xca) {
                  *status = 0;
                  ffghsp(tmpfptr,&nkeys,(int *)&local_27c8,status);
                  ffgrec(tmpfptr,nkeys,card,status);
                  iVar5 = *status;
                }
LAB_001760fb:
                if (iVar5 != 0) goto LAB_00175565;
              }
LAB_00175f1f:
              local_27d8 = local_27d8 + 1;
              ffrtnm(tmpfptr->Fptr->filename,tmprootname,status);
              ffrtnm(gfptr->Fptr->filename,grootname,status);
              if ((tmpfptr->Fptr == gfptr->Fptr) ||
                 (iVar5 = strncmp(tmprootname,grootname,0x401), uVar1 = local_27d8, iVar5 == 0)) {
                snprintf(keyword,0x4b,"GRPID%d",local_27d8);
                ffikyj(tmpfptr,keyword,groupExtver,"EXTVER of Group containing this HDU",status);
              }
              else {
                snprintf(keyword,0x4b,"GRPID%d",local_27d8 & 0xffffffff);
                ffikyj(tmpfptr,keyword,groupExtver,"EXTVER of Group containing this HDU",status);
                snprintf(keyword,0x4b,"GRPLC%d",uVar1 & 0xffffffff);
                ffikls(tmpfptr,keyword,groupFileName,"URL of file containing Group",status);
                ffplsw(tmpfptr,status);
              }
              goto LAB_00175565;
            }
            pcVar9 = "HDU already has GRPID/LC keywords for group table (ffgtam)";
          }
          ffpmsg(pcVar9);
        }
      }
    }
LAB_00175565:
    if (mfptr != (fitsfile *)0x0) {
      iVar5 = *status;
      goto LAB_001755af;
    }
  }
  iVar5 = ffclos(tmpfptr,status);
LAB_001755af:
  if (iVar5 != 0) {
    iVar4 = iVar5;
  }
  *status = iVar4;
  return iVar4;
}

Assistant:

int ffgtam(fitsfile *gfptr,   /* FITS file pointer to grouping table HDU     */
	   fitsfile *mfptr,   /* FITS file pointer to member HDU             */
	   int       hdupos,  /* member HDU position IF in the same file as
			         the grouping table AND mfptr == NULL        */
	   int      *status)  /* return status code                          */
 
/*
  add a member HDU to an existing grouping table. The fitsfile pointer gfptr
  must be positioned with the grouping table as the CHDU. The member HDU
  may either be identifed with the fitsfile *mfptr (which must be positioned
  to the member HDU) or the hdupos parameter (the HDU number of the member 
  HDU) if both reside in the same FITS file. The hdupos value is only used
  if the mfptr parameter has a value of NULL (0). The new member HDU shall 
  have the appropriate GRPIDn and GRPLCn keywords created in its header.

  Note that if the member HDU to be added to the grouping table is already
  a member of the group then it will not be added a sceond time.
*/

{
  int xtensionCol,extnameCol,extverCol,positionCol,locationCol,uriCol;
  int memberPosition = 0;
  int grptype        = 0;
  int hdutype        = 0;
  int useLocation    = 0;
  int nkeys          = 6;
  int found;
  int i;

  int memberIOstate;
  int groupIOstate;
  int iomode;

  long memberExtver = 0;
  long groupExtver  = 0;
  long memberID     = 0;
  long nmembers     = 0;
  long ngroups      = 0;
  long grpid        = 0;

  char memberAccess1[FLEN_VALUE];
  char memberAccess2[FLEN_VALUE];
  char memberFileName[FLEN_FILENAME];
  char memberLocation[FLEN_FILENAME];
  char grplc[FLEN_FILENAME];
  char *tgrplc;
  char memberHDUtype[FLEN_VALUE];
  char memberExtname[FLEN_VALUE];
  char memberURI[] = "URL";

  char groupAccess1[FLEN_VALUE];
  char groupAccess2[FLEN_VALUE];
  char groupFileName[FLEN_FILENAME];
  char groupLocation[FLEN_FILENAME];
  char tmprootname[FLEN_FILENAME], grootname[FLEN_FILENAME];
  char cwd[FLEN_FILENAME];

  char *keys[] = {"GRPNAME","EXTVER","EXTNAME","TFIELDS","GCOUNT","EXTEND"};
  char *tmpPtr[1];

  char keyword[FLEN_KEYWORD];
  char card[FLEN_CARD];

  unsigned char charNull[]  = {'\0'};

  fitsfile *tmpfptr = NULL;

  int parentStatus = 0;

  if(*status != 0) return(*status);

  do
    {
      /*
	make sure the grouping table can be modified before proceeding
      */

      fits_file_mode(gfptr,&iomode,status);

      if(iomode != READWRITE)
	{
	  ffpmsg("cannot modify grouping table (ffgtam)");
	  *status = BAD_GROUP_ATTACH;
	  continue;
	}

      /*
	 if the calling function supplied the HDU position of the member
	 HDU instead of fitsfile pointer then get a fitsfile pointer
      */

      if(mfptr == NULL)
	{
	  *status = fits_reopen_file(gfptr,&tmpfptr,status);
	  *status = fits_movabs_hdu(tmpfptr,hdupos,&hdutype,status);

	  if(*status != 0) continue;
	}
      else
	tmpfptr = mfptr;

      /*
	 determine all the information about the member HDU that will
	 be needed later; note that we establish the default values for
	 all information values that are not explicitly found
      */

      *status = fits_read_key_str(tmpfptr,"XTENSION",memberHDUtype,card,
				  status);

      if(*status == KEY_NO_EXIST) 
	{
	  strcpy(memberHDUtype,"PRIMARY");
	  *status = 0;
	}
      prepare_keyvalue(memberHDUtype);

      *status = fits_read_key_lng(tmpfptr,"EXTVER",&memberExtver,card,status);

      if(*status == KEY_NO_EXIST) 
	{
	  memberExtver = 1;
	  *status      = 0;
	}

      *status = fits_read_key_str(tmpfptr,"EXTNAME",memberExtname,card,
				  status);

      if(*status == KEY_NO_EXIST) 
	{
	  memberExtname[0] = 0;
	  *status          = 0;
	}
      prepare_keyvalue(memberExtname);

      fits_get_hdu_num(tmpfptr,&memberPosition);

      /*
	Determine if the member HDU's FITS file location needs to be
	taken into account when building its grouping table reference

	If the member location needs to be used (==> grouping table and member
	HDU reside in different files) then create an appropriate URL for
	the member HDU's file and grouping table's file. Note that the logic
	for this is rather complicated
      */

      /* SPR 3463, don't do this 
	 if(tmpfptr->Fptr == gfptr->Fptr)
	 {  */
	  /*
	    member HDU and grouping table reside in the same file, no need
	    to use the location information */
	  
      /* printf ("same file\n");
	   
	   useLocation     = 0;
	   memberIOstate   = 1;
	   *memberFileName = 0;
	}
      else
      { */ 
	  /*
	     the member HDU and grouping table FITS file location information 
	     must be used.

	     First determine the correct driver and file name for the group
	     table and member HDU files. If either are disk files then
	     construct an absolute file path for them. Finally, if both are
	     disk files construct relative file paths from the group(member)
	     file to the member(group) file.

	  */

	  /* set the USELOCATION flag to true */

	  useLocation = 1;

	  /* 
	     get the location, access type and iostate (RO, RW) of the
	     member HDU file
	  */

	  *status = fits_get_url(tmpfptr,memberFileName,memberLocation,
				 memberAccess1,memberAccess2,&memberIOstate,
				 status);

	  /*
	     if the memberFileName string is empty then use the values of
	     the memberLocation string. This corresponds to a file where
	     the "real" file is a temporary memory file, and we must assume
	     the the application really wants the original file to be the
	     group member
	   */

	  if(strlen(memberFileName) == 0)
	    {
	      strcpy(memberFileName,memberLocation);
	      strcpy(memberAccess1,memberAccess2);
	    }

	  /* 
	     get the location, access type and iostate (RO, RW) of the
	     grouping table file
	  */

	  *status = fits_get_url(gfptr,groupFileName,groupLocation,
				 groupAccess1,groupAccess2,&groupIOstate,
				 status);
	  
	  if(*status != 0) continue;

	  /*
	    the grouping table file must be writable to continue
	  */

	  if(groupIOstate == 0)
	    {
	      ffpmsg("cannot modify grouping table (ffgtam)");
	      *status = BAD_GROUP_ATTACH;
	      continue;
	    }

	  /*
	    determine how to construct the resulting URLs for the member and
	    group files
	  */

	  if(fits_strcasecmp(groupAccess1,"file://")  &&
	                                   fits_strcasecmp(memberAccess1,"file://"))
	    {
              *cwd = 0;
	      /* 
		 nothing to do in this case; both the member and group files
		 must be of an access type that already gives valid URLs;
		 i.e., URLs that we can pass directly to the file drivers
	      */
	    }
	  else
	    {
	      /*
		 retrieve the Current Working Directory as a Unix-like
		 URL standard string
	      */

	      *status = fits_get_cwd(cwd,status);

	      /*
		 create full file path for the member HDU FITS file URL
		 if it is of access type file://
	      */
	      
	      if(fits_strcasecmp(memberAccess1,"file://") == 0)
		{
		  if(*memberFileName == '/')
		    {
		      strcpy(memberLocation,memberFileName);
		    }
		  else
		    {
		      strcpy(memberLocation,cwd);
                      if (strlen(memberLocation)+strlen(memberFileName)+1 > 
                                FLEN_FILENAME-1)
                      {
                         ffpmsg("member path and filename is too long (ffgtam)");
                         *status = URL_PARSE_ERROR;
                         continue;
                      }
		      strcat(memberLocation,"/");
		      strcat(memberLocation,memberFileName);
		    }
		  
		  *status = fits_clean_url(memberLocation,memberFileName,
					   status);
		}

	      /*
		 create full file path for the grouping table HDU FITS file URL
		 if it is of access type file://
	      */

	      if(fits_strcasecmp(groupAccess1,"file://") == 0)
		{
		  if(*groupFileName == '/')
		    {
		      strcpy(groupLocation,groupFileName);
		    }
		  else
		    {
		      strcpy(groupLocation,cwd);
                      if (strlen(groupLocation)+strlen(groupFileName)+1 > 
                                FLEN_FILENAME-1)
                      {
                         ffpmsg("group path and filename is too long (ffgtam)");
                         *status = URL_PARSE_ERROR;
                         continue;
                      }
                      
		      strcat(groupLocation,"/");
		      strcat(groupLocation,groupFileName);
		    }
		  
		  *status = fits_clean_url(groupLocation,groupFileName,status);
		}

	      /*
		if both the member and group files are disk files then 
		create a relative path (relative URL) strings with 
		respect to the grouping table's file and the grouping table's 
		file with respect to the member HDU's file
	      */
	      
	      if(fits_strcasecmp(groupAccess1,"file://") == 0 &&
		                      fits_strcasecmp(memberAccess1,"file://") == 0)
		{
		  fits_url2relurl(memberFileName,groupFileName,
				                  groupLocation,status);
		  fits_url2relurl(groupFileName,memberFileName,
				                  memberLocation,status);

		  /*
		     copy the resulting partial URL strings to the
		     memberFileName and groupFileName variables for latter
		     use in the function
		   */
		    
		  strcpy(memberFileName,memberLocation);
		  strcpy(groupFileName,groupLocation);		  
		}
	    }
	  /* beo done */
	  /* }  */
      

      /* retrieve the grouping table's EXTVER value */

      *status = fits_read_key_lng(gfptr,"EXTVER",&groupExtver,card,status);

      /* 
	 if useLocation is true then make the group EXTVER value negative
	 for the subsequent GRPIDn/GRPLCn matching
      */
      /* SPR 3463 change test;  WDP added test for same filename */
      /* Now, if either the Fptr values are the same, or the root filenames
         are the same, then assume these refer to the same file.
      */
      fits_parse_rootname(tmpfptr->Fptr->filename, tmprootname, status);
      fits_parse_rootname(gfptr->Fptr->filename, grootname, status);

      if((tmpfptr->Fptr != gfptr->Fptr) && 
          strncmp(tmprootname, grootname, FLEN_FILENAME))
	   groupExtver = -1*groupExtver;

      /* retrieve the number of group members */

      *status = fits_get_num_members(gfptr,&nmembers,status);
	      
    do {

      /*
	 make sure the member HDU is not already an entry in the
	 grouping table before adding it
      */

      *status = ffgmf(gfptr,memberHDUtype,memberExtname,memberExtver,
		      memberPosition,memberFileName,&memberID,status);

      if(*status == MEMBER_NOT_FOUND) *status = 0;
      else if(*status == 0)
	{  
	  parentStatus = HDU_ALREADY_MEMBER;
    ffpmsg("Specified HDU is already a member of the Grouping table (ffgtam)");
	  continue;
	}
      else continue;

      /*
	 if the member HDU is not already recorded in the grouping table
	 then add it 
      */

      /* add a new row to the grouping table */

      *status = fits_insert_rows(gfptr,nmembers,1,status);
      ++nmembers;

      /* retrieve the grouping table column IDs and structure type */

      *status = ffgtgc(gfptr,&xtensionCol,&extnameCol,&extverCol,&positionCol,
		       &locationCol,&uriCol,&grptype,status);

      /* fill in the member HDU data in the new grouping table row */

      *tmpPtr = memberHDUtype; 

      if(xtensionCol != 0)
	fits_write_col_str(gfptr,xtensionCol,nmembers,1,1,tmpPtr,status);

      *tmpPtr = memberExtname; 

      if(extnameCol  != 0)
	{
	  if(strlen(memberExtname) != 0)
	    fits_write_col_str(gfptr,extnameCol,nmembers,1,1,tmpPtr,status);
	  else
	    /* WILL THIS WORK FOR VAR LENTH CHAR COLS??????*/
	    fits_write_col_byt(gfptr,extnameCol,nmembers,1,1,charNull,status);
	}

      if(extverCol   != 0)
	fits_write_col_lng(gfptr,extverCol,nmembers,1,1,&memberExtver,
			   status);

      if(positionCol != 0)
	fits_write_col_int(gfptr,positionCol,nmembers,1,1,
			   &memberPosition,status);

      *tmpPtr = memberFileName; 

      if(locationCol != 0)
	{
	  /* Change the test for SPR 3463 */
	  /* Now, if either the Fptr values are the same, or the root filenames
	     are the same, then assume these refer to the same file.
	  */
	  fits_parse_rootname(tmpfptr->Fptr->filename, tmprootname, status);
	  fits_parse_rootname(gfptr->Fptr->filename, grootname, status);

	  if((tmpfptr->Fptr != gfptr->Fptr) && 
	          strncmp(tmprootname, grootname, FLEN_FILENAME))
	    fits_write_col_str(gfptr,locationCol,nmembers,1,1,tmpPtr,status);
	  else
	    /* WILL THIS WORK FOR VAR LENTH CHAR COLS??????*/
	    fits_write_col_byt(gfptr,locationCol,nmembers,1,1,charNull,status);
	}

      *tmpPtr = memberURI;

      if(uriCol      != 0)
	{

	  /* Change the test for SPR 3463 */
	  /* Now, if either the Fptr values are the same, or the root filenames
	     are the same, then assume these refer to the same file.
	  */
	  fits_parse_rootname(tmpfptr->Fptr->filename, tmprootname, status);
	  fits_parse_rootname(gfptr->Fptr->filename, grootname, status);

	  if((tmpfptr->Fptr != gfptr->Fptr) && 
	          strncmp(tmprootname, grootname, FLEN_FILENAME))
	    fits_write_col_str(gfptr,uriCol,nmembers,1,1,tmpPtr,status);
	  else
	    /* WILL THIS WORK FOR VAR LENTH CHAR COLS??????*/
	    fits_write_col_byt(gfptr,uriCol,nmembers,1,1,charNull,status);
	}
    } while(0);

      if(0 != *status) continue;
      /*
	 add GRPIDn/GRPLCn keywords to the member HDU header to link
	 it to the grouing table if the they do not already exist and
	 the member file is RW
      */

      fits_file_mode(tmpfptr,&iomode,status);
 
     if(memberIOstate == 0 || iomode != READWRITE) 
	{
	  ffpmsg("cannot add GRPID/LC keywords to member HDU: (ffgtam)");
	  ffpmsg(memberFileName);
	  continue;
	}

      *status = fits_get_num_groups(tmpfptr,&ngroups,status);

      /* 
	 look for the GRPID/LC keywords in the member HDU; if the keywords
	 for the back-link to the grouping table already exist then no
	 need to add them again
       */

      for(i = 1, found = 0; i <= ngroups && !found && *status == 0; ++i)
	{
	  snprintf(keyword,FLEN_KEYWORD,"GRPID%d",(int)ngroups);
	  *status = fits_read_key_lng(tmpfptr,keyword,&grpid,card,status);

	  if(grpid == groupExtver)
	    {
	      if(grpid < 0)
		{

		  /* have to make sure the GRPLCn keyword matches too */

		  snprintf(keyword,FLEN_KEYWORD,"GRPLC%d",(int)ngroups);
		  /* SPR 1738 */
		  *status = fits_read_key_longstr(mfptr,keyword,&tgrplc,card,
						  status);
		  if (0 == *status) {
		    strcpy(grplc,tgrplc);
		    free(tgrplc);
		  }
		  
		  /*
		     always compare files using absolute paths
                     the presence of a non-empty cwd indicates
                     that the file names may require conversion
                     to absolute paths
                  */

                  if(0 < strlen(cwd)) {
                    /* temp buffer for use in assembling abs. path(s) */
                    char tmp[FLEN_FILENAME];

                    /* make grplc absolute if necessary */
                    if(!fits_is_url_absolute(grplc)) {
		      fits_path2url(grplc,FLEN_FILENAME,groupLocation,status);

		      if(groupLocation[0] != '/')
			{
			  strcpy(tmp, cwd);
                          if (strlen(tmp)+strlen(groupLocation)+1 > 
                                    FLEN_FILENAME-1)
                          {
                             ffpmsg("path and group location is too long (ffgtam)");
                             *status = URL_PARSE_ERROR;
                             continue;
                          }
			  strcat(tmp,"/");
			  strcat(tmp,groupLocation);
			  fits_clean_url(tmp,grplc,status);
			}
                    }

                    /* make groupFileName absolute if necessary */
                    if(!fits_is_url_absolute(groupFileName)) {
		      fits_path2url(groupFileName,FLEN_FILENAME,groupLocation,status);

		      if(groupLocation[0] != '/')
			{
			  strcpy(tmp, cwd);
                          if (strlen(tmp)+strlen(groupLocation)+1 > 
                                    FLEN_FILENAME-1)
                          {
                             ffpmsg("path and group location is too long (ffgtam)");
                             *status = URL_PARSE_ERROR;
                             continue;
                          }
			  strcat(tmp,"/");
			  strcat(tmp,groupLocation);
                          /*
                             note: use groupLocation (which is not used
                             below this block), to store the absolute
                             file name instead of using groupFileName.
                             The latter may be needed unaltered if the
                             GRPLC is written below
                          */

			  fits_clean_url(tmp,groupLocation,status);
			}
                    }
                  }
		  /*
		    see if the grplc value and the group file name match
		  */

		  if(strcmp(grplc,groupLocation) == 0) found = 1;
		}
	      else
		{
		  /* the match is found with GRPIDn alone */
		  found = 1;
		}
	    }
	}

      /*
	 if FOUND is true then no need to continue
      */

      if(found)
	{
	  ffpmsg("HDU already has GRPID/LC keywords for group table (ffgtam)");
	  continue;
	}

      /*
	 add the GRPID/LC keywords to the member header for this grouping
	 table
	 
	 If NGROUPS == 0 then we must position the header pointer to the
	 record where we want to insert the GRPID/LC keywords (the pointer
	 is already correctly positioned if the above search loop activiated)
      */

      if(ngroups == 0)
	{
	  /* 
	     no GRPIDn/GRPLCn keywords currently exist in header so try
	     to position the header pointer to a desirable position
	  */
	  
	  for(i = 0, *status = KEY_NO_EXIST; 
	                       i < nkeys && *status == KEY_NO_EXIST; ++i)
	    {
	      *status = 0;
	      *status = fits_read_card(tmpfptr,keys[i],card,status);
	    }
	      
	  /* all else fails: move write pointer to end of header */
	      
	  if(*status == KEY_NO_EXIST)
	    {
	      *status = 0;
	      fits_get_hdrspace(tmpfptr,&nkeys,&i,status);
	      ffgrec(tmpfptr,nkeys,card,status);
	    }
	  
	  /* any other error status then abort */
	  
	  if(*status != 0) continue;
	}
      
      /* 
	 now that the header pointer is positioned for the GRPID/LC 
	 keyword insertion increment the number of group links counter for 
	 the member HDU 
      */

      ++ngroups;

      /*
	 if the member HDU and grouping table reside in the same FITS file
	 then there is no need to add a GRPLCn keyword
      */
      /* SPR 3463 change test */
      /* Now, if either the Fptr values are the same, or the root filenames
	 are the same, then assume these refer to the same file.
      */
      fits_parse_rootname(tmpfptr->Fptr->filename, tmprootname, status);
      fits_parse_rootname(gfptr->Fptr->filename, grootname, status);

      if((tmpfptr->Fptr == gfptr->Fptr) || 
	          strncmp(tmprootname, grootname, FLEN_FILENAME) == 0)
	{
	  /* add the GRPIDn keyword only */

	  snprintf(keyword,FLEN_KEYWORD,"GRPID%d",(int)ngroups);
	  fits_insert_key_lng(tmpfptr,keyword,groupExtver,
			      "EXTVER of Group containing this HDU",status);
	}
      else 
	{
	  /* add the GRPIDn and GRPLCn keywords */

	  snprintf(keyword,FLEN_KEYWORD,"GRPID%d",(int)ngroups);
	  fits_insert_key_lng(tmpfptr,keyword,groupExtver,
			      "EXTVER of Group containing this HDU",status);

	  snprintf(keyword,FLEN_KEYWORD,"GRPLC%d",(int)ngroups);
	  /* SPR 1738 */
	  fits_insert_key_longstr(tmpfptr,keyword,groupFileName,
			      "URL of file containing Group",status);
	  fits_write_key_longwarn(tmpfptr,status);

	}

    }while(0);

  /* close the tmpfptr pointer if it was opened in this function */

  if(mfptr == NULL)
    {
      *status = fits_close_file(tmpfptr,status);
    }

  *status = 0 == *status ? parentStatus : *status;

  return(*status);
}